

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_string.c
# Opt level: O0

char * nhr_string_copy_len(char *str,size_t len)

{
  char *local_30;
  char *s;
  size_t len_local;
  char *str_local;
  
  if ((str == (char *)0x0) || (len == 0)) {
    local_30 = (char *)0x0;
  }
  else {
    local_30 = (char *)nhr_malloc(len + 1);
  }
  if (local_30 == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    memcpy(local_30,str,len);
    local_30[len] = '\0';
    str_local = local_30;
  }
  return str_local;
}

Assistant:

char * nhr_string_copy_len(const char * str, const size_t len) {
	char * s = (str && len > 0) ? (char *)nhr_malloc(len + 1) : NULL;
	if (s) {
		memcpy(s, str, len);
		s[len] = 0;
		return s;
	}
	return NULL;
}